

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O2

void __thiscall SDT::Stmt1::dfs(Stmt1 *this,TreeNode *treeNode,SDTNode *fa)

{
  Noelse *this_00;
  undefined8 extraout_RAX;
  Noelse *local_18;
  
  this_00 = (Noelse *)operator_new(0x48);
  Noelse::Noelse(this_00);
  local_18 = this_00;
  std::vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>>::emplace_back<SDT::SDTNode*>
            ((vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>> *)&(this->super_SDTNode).sons,
             (SDTNode **)&local_18);
  operator_delete(this_00,0x48);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Stmt1::dfs(TreeNode &treeNode, SDT::SDTNode *fa) {
        if (treeNode.sons.empty()){
            writeLabel(gotoBegin);
            return;
        }
        Noelse *noelse = new Noelse;
        sons.push_back(noelse);
        writeLabel(gotoBegin);
        noelse->gotoNext = gotoNext;
        noelse->dfs(SON(1));
    }